

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<unsigned_short>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<unsigned_short> min,WrappedType<unsigned_short> max,float gridSize)

{
  uint uVar1;
  deUint32 dVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  short sVar13;
  short sVar14;
  int iVar15;
  short sVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  deRandom rnd;
  uint local_b4;
  ulong local_98;
  deRandom local_80;
  char *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  local_68 = (ulong)(uint)(componentCount * 2);
  if (stride != 0) {
    local_68 = (ulong)(uint)stride;
  }
  local_38 = (ulong)(uint)((int)local_68 * 2);
  iVar5 = (int)local_68 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar5 = 0;
  }
  local_70 = (char *)operator_new__((long)(iVar5 * count + offset));
  deRandom_init(&local_80,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar20 = (float)max.m_value - (float)min.m_value;
    uVar19 = -(uint)(-fVar20 <= fVar20);
    uVar6 = (uint)((float)(~uVar19 & (uint)-fVar20 | (uint)fVar20 & uVar19) * gridSize);
    uVar19 = 0x400;
    if (0x400 < (uVar6 & 0xffff)) {
      uVar19 = uVar6;
    }
    if (0 < count) {
      local_40 = local_70 + offset;
      uVar6 = (uint)max.m_value - (uint)min.m_value;
      uVar1 = uVar19 & 0xffff;
      iVar11 = (int)local_68;
      local_48 = (ulong)(uint)(iVar11 * 3);
      local_50 = (ulong)(uint)(iVar11 * 4);
      local_58 = (ulong)(uint)(iVar11 * 5);
      local_60 = (ulong)(uint)count;
      iVar11 = 4;
      iVar12 = 6;
      local_98 = 0;
      do {
        local_b4 = 0;
        while( true ) {
          uVar9 = (uint)min.m_value;
          if (min.m_value < max.m_value) {
            dVar2 = deRandom_getUint32(&local_80);
            uVar9 = dVar2 % uVar6 + (uint)min.m_value;
          }
          iVar10 = uVar9 - (uVar9 & 0xffff) % (uVar19 & 0xffff);
          uVar17 = (uint)max.m_value - iVar10;
          uVar9 = uVar19;
          if ((ushort)uVar19 < (ushort)uVar17) {
            dVar2 = deRandom_getUint32(&local_80);
            uVar9 = dVar2 % ((uVar17 & 0xffff) - uVar1) + uVar19;
          }
          uVar17 = (uint)min.m_value;
          if (min.m_value < max.m_value) {
            dVar2 = deRandom_getUint32(&local_80);
            uVar17 = dVar2 % uVar6 + (uint)min.m_value;
          }
          iVar15 = uVar17 - (uVar17 & 0xffff) % (uVar19 & 0xffff);
          uVar18 = (uint)max.m_value - iVar15;
          uVar17 = uVar19;
          if ((ushort)uVar19 < (ushort)uVar18) {
            dVar2 = deRandom_getUint32(&local_80);
            uVar17 = dVar2 % ((uVar18 & 0xffff) - uVar1) + uVar19;
          }
          uVar18 = 0;
          if (2 < componentCount) {
            uVar18 = (uint)min.m_value;
            if (min.m_value < max.m_value) {
              dVar2 = deRandom_getUint32(&local_80);
              uVar18 = dVar2 % uVar6 + (uint)min.m_value;
            }
            uVar18 = uVar18 - (uVar18 & 0xffff) % (uVar19 & 0xffff);
          }
          uVar7 = 1;
          if (3 < componentCount) {
            uVar7 = (uint)min.m_value;
            if (min.m_value < max.m_value) {
              dVar2 = deRandom_getUint32(&local_80);
              uVar7 = dVar2 % uVar6 + (uint)min.m_value;
            }
            uVar7 = uVar7 - (uVar7 & 0xffff) % (uVar19 & 0xffff);
          }
          uVar9 = uVar9 - (uVar9 & 0xffff) % (uVar19 & 0xffff);
          uVar17 = uVar17 - (uVar17 & 0xffff) % (uVar19 & 0xffff);
          if ((componentCount < 3) ||
             (((uVar1 <= (uVar18 & 0xffff) + (uVar9 & 0xffff) &&
               (uVar1 <= (uVar7 & 0xffff) + (uVar17 & 0xffff))) || (2 < local_b4)))) break;
          local_b4 = local_b4 + 1;
        }
        iVar3 = iVar5 * (int)local_98;
        sVar8 = (short)iVar10;
        *(short *)(local_40 + iVar3) = sVar8;
        sVar14 = (short)iVar15;
        *(short *)(local_40 + (iVar3 + 2)) = sVar14;
        iVar10 = (int)local_68;
        sVar13 = (short)uVar9 + sVar8;
        *(short *)(local_40 + (iVar3 + iVar10)) = sVar13;
        *(short *)(local_40 + (iVar3 + iVar10 + 2)) = sVar14;
        sVar16 = (short)uVar17 + sVar14;
        *(short *)(local_40 + (iVar3 + (int)local_38)) = sVar8;
        *(short *)(local_40 + (iVar3 + (int)local_38 + 2)) = sVar16;
        *(short *)(local_40 + (iVar3 + (int)local_48)) = sVar8;
        *(short *)(local_40 + (iVar3 + 2 + (int)local_48)) = sVar16;
        *(short *)(local_40 + (iVar3 + (int)local_50)) = sVar13;
        *(short *)(local_40 + (iVar3 + 2 + (int)local_50)) = sVar14;
        *(short *)(local_40 + (iVar3 + (int)local_58)) = sVar13;
        *(short *)(local_40 + (iVar3 + 2 + (int)local_58)) = sVar16;
        if (2 < componentCount) {
          lVar4 = 6;
          iVar15 = iVar11;
          do {
            *(short *)(local_40 + iVar15) = (short)uVar18;
            iVar15 = iVar15 + iVar10;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
        }
        if (3 < componentCount) {
          lVar4 = 6;
          iVar15 = iVar12;
          do {
            *(short *)(local_40 + iVar15) = (short)uVar7;
            iVar15 = iVar15 + iVar10;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
        }
        local_98 = local_98 + 1;
        iVar11 = iVar11 + iVar5;
        iVar12 = iVar12 + iVar5;
      } while (local_98 != local_60);
    }
  }
  return local_70;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}